

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O2

LClosure * luaY_parser(lua_State *L,ZIO *z,Mbuffer *buff,Dyndata *dyd,char *name,int firstchar)

{
  StkId pTVar1;
  Table *x__1;
  LClosure *pLVar2;
  Proto *pPVar3;
  TString *source;
  LClosure *x_;
  expdesc local_110;
  BlockCnt bl;
  FuncState funcstate;
  LexState lexstate;
  
  pLVar2 = luaF_newLclosure(L,1);
  pTVar1 = L->top;
  (pTVar1->value_).gc = (GCObject *)pLVar2;
  pTVar1->tt_ = 0x46;
  luaD_inctop(L);
  lexstate.h = luaH_new(L);
  pTVar1 = L->top;
  (pTVar1->value_).gc = (GCObject *)lexstate.h;
  pTVar1->tt_ = 0x45;
  luaD_inctop(L);
  pPVar3 = luaF_newproto(L);
  pLVar2->p = pPVar3;
  funcstate.f = pPVar3;
  source = luaS_new(L,name);
  pPVar3->source = source;
  (dyd->label).n = 0;
  (dyd->gt).n = 0;
  (dyd->actvar).n = 0;
  lexstate.buff = buff;
  lexstate.dyd = dyd;
  luaX_setinput(L,&lexstate,z,source,firstchar);
  open_func(&lexstate,&funcstate,&bl);
  (funcstate.f)->is_vararg = '\x01';
  local_110.t = -1;
  local_110.f = -1;
  local_110.k = VLOCAL;
  local_110.u.info = 0;
  newupvalue(&funcstate,lexstate.envn,&local_110);
  luaX_next(&lexstate);
  statlist(&lexstate);
  check(&lexstate,0x121);
  close_func(&lexstate);
  L->top = L->top + -1;
  return pLVar2;
}

Assistant:

LClosure *luaY_parser (lua_State *L, ZIO *z, Mbuffer *buff,
                       Dyndata *dyd, const char *name, int firstchar) {
  LexState lexstate;
  FuncState funcstate;
  LClosure *cl = luaF_newLclosure(L, 1);  /* create main closure */
  setclLvalue(L, L->top, cl);  /* anchor it (to avoid being collected) */
  luaD_inctop(L);
  lexstate.h = luaH_new(L);  /* create table for scanner */
  sethvalue(L, L->top, lexstate.h);  /* anchor it */
  luaD_inctop(L);
  funcstate.f = cl->p = luaF_newproto(L);
  funcstate.f->source = luaS_new(L, name);  /* create and anchor TString */
  lua_assert(iswhite(funcstate.f));  /* do not need barrier here */
  lexstate.buff = buff;
  lexstate.dyd = dyd;
  dyd->actvar.n = dyd->gt.n = dyd->label.n = 0;
  luaX_setinput(L, &lexstate, z, funcstate.f->source, firstchar);
  mainfunc(&lexstate, &funcstate);
  lua_assert(!funcstate.prev && funcstate.nups == 1 && !lexstate.fs);
  /* all scopes should be correctly finished */
  lua_assert(dyd->actvar.n == 0 && dyd->gt.n == 0 && dyd->label.n == 0);
  L->top--;  /* remove scanner's table */
  return cl;  /* closure is on the stack, too */
}